

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O0

void __thiscall HBT_correlation::calculate_flow_event_plane_angle(HBT_correlation *this,int n_order)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  particleSamples *in_RDI;
  double dVar3;
  double temp_phi;
  double temp_py;
  double temp_px;
  int i;
  int event_number_particle;
  int iev;
  double vn_imag;
  double vn_real;
  int nev;
  int in_stack_fffffffffffffebc;
  double in_stack_fffffffffffffec8;
  particleSamples *in_stack_fffffffffffffed0;
  double local_110;
  double local_98;
  int local_2c;
  int local_24;
  double local_20;
  double local_18;
  
  std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15811c);
  iVar1 = particleSamples::get_number_of_events((particleSamples *)0x158124);
  local_18 = 0.0;
  local_20 = 0.0;
  for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x158170);
    iVar2 = particleSamples::get_number_of_particles(in_RDI,in_stack_fffffffffffffebc);
    for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1581b3);
      particleSamples::get_particle
                (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 SUB84(in_stack_fffffffffffffec8,0));
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1581f1);
      particleSamples::get_particle
                (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 SUB84(in_stack_fffffffffffffec8,0));
      in_stack_fffffffffffffec8 = atan2(local_110,local_98);
      dVar3 = cos((double)in_ESI * in_stack_fffffffffffffec8);
      local_18 = dVar3 + local_18;
      dVar3 = sin((double)in_ESI * in_stack_fffffffffffffec8);
      local_20 = dVar3 + local_20;
    }
  }
  dVar3 = atan2(local_20,local_18);
  *(double *)&in_RDI->field_0x210 = dVar3 / (double)in_ESI;
  return;
}

Assistant:

void HBT_correlation::calculate_flow_event_plane_angle(int n_order) {
    int nev = particle_list->get_number_of_events();
    double vn_real = 0.0;
    double vn_imag = 0.0;
    for (int iev = 0; iev < nev; iev++) {
        int event_number_particle =
            (particle_list->get_number_of_particles(iev));
        for (int i = 0; i < event_number_particle; i++) {
            double temp_px = particle_list->get_particle(iev, i).px;
            double temp_py = particle_list->get_particle(iev, i).py;
            double temp_phi = atan2(temp_py, temp_px);
            vn_real += cos(n_order * temp_phi);
            vn_imag += sin(n_order * temp_phi);
        }
    }
    psi_ref = atan2(vn_imag, vn_real) / n_order;
}